

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  uint uVar1;
  bool bVar2;
  Var VVar3;
  ulong uVar4;
  Clause *pCVar5;
  uint *puVar6;
  char *pcVar7;
  int i;
  long lVar8;
  int iVar9;
  int i_1;
  lbool local_69;
  Var max;
  uint local_64;
  RegionAllocator<unsigned_int> *local_60;
  vec<int,_int> map;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  max = 0;
  map.data = (int *)0x0;
  map.sz = 0;
  map.cap = 0;
  local_60 = &(this->ca).ra;
  iVar9 = 0;
  for (lVar8 = 0; uVar4 = (ulong)(this->clauses).sz, lVar8 < (long)uVar4; lVar8 = lVar8 + 1) {
    pCVar5 = (Clause *)
             RegionAllocator<unsigned_int>::operator[](local_60,(this->clauses).data[lVar8]);
    bVar2 = satisfied(this,pCVar5);
    iVar9 = iVar9 + (uint)!bVar2;
  }
  local_64 = iVar9;
  for (lVar8 = 0; lVar8 < (int)uVar4; lVar8 = lVar8 + 1) {
    pCVar5 = (Clause *)
             RegionAllocator<unsigned_int>::operator[](local_60,(this->clauses).data[lVar8]);
    bVar2 = satisfied(this,pCVar5);
    if (!bVar2) {
      puVar6 = RegionAllocator<unsigned_int>::operator[](local_60,(this->clauses).data[lVar8]);
      for (uVar4 = 0; uVar4 < *puVar6 >> 5; uVar4 = uVar4 + 1) {
        local_69 = value(this,(Lit)puVar6[uVar4 + 1]);
        bVar2 = lbool::operator!=(&local_69,l_False);
        if (bVar2) {
          mapVar((int)puVar6[uVar4 + 1] >> 1,&map,&max);
        }
      }
    }
    uVar4 = (ulong)(uint)(this->clauses).sz;
  }
  local_64 = local_64 + assumps->sz;
  fprintf((FILE *)f,"p cnf %d %d\n",(ulong)(uint)max);
  lVar8 = 0;
  while( true ) {
    uVar1 = local_64;
    if (assumps->sz <= lVar8) {
      for (lVar8 = 0; lVar8 < (this->clauses).sz; lVar8 = lVar8 + 1) {
        pCVar5 = (Clause *)
                 RegionAllocator<unsigned_int>::operator[](local_60,(this->clauses).data[lVar8]);
        toDimacs(this,f,pCVar5,&map,&max);
      }
      if (0 < this->verbosity) {
        printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)(uint)max,(ulong)uVar1);
      }
      vec<int,_int>::~vec(&map);
      return;
    }
    local_69 = value(this,(Lit)assumps->data[lVar8].x);
    bVar2 = lbool::operator!=(&local_69,l_False);
    if (!bVar2) break;
    uVar1 = assumps->data[lVar8].x;
    VVar3 = mapVar((int)uVar1 >> 1,&map,&max);
    pcVar7 = "-";
    if ((uVar1 & 1) == 0) {
      pcVar7 = "";
    }
    fprintf((FILE *)f,"%s%d 0\n",pcVar7,(ulong)(VVar3 + 1));
    lVar8 = lVar8 + 1;
  }
  __assert_fail("value(assumps[i]) != l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                ,0x3d3,"void Minisat::Solver::toDimacs(FILE *, const vec<Lit> &)");
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}